

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_sectoraction.cpp
# Opt level: O1

bool __thiscall
ASecActHitFakeFloor::DoTriggerAction(ASecActHitFakeFloor *this,AActor *triggerer,int activationType)

{
  AActor *pAVar1;
  bool bVar2;
  byte bVar3;
  
  bVar3 = 0;
  bVar2 = false;
  if (((uint)activationType >> 10 & 1) != 0) {
    bVar2 = ASectorAction::CheckTrigger(&this->super_ASectorAction,triggerer);
  }
  pAVar1 = (this->super_ASectorAction).super_AActor.tracer.field_0.p;
  if (pAVar1 != (AActor *)0x0) {
    if (((pAVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      bVar3 = (**(code **)((long)(pAVar1->super_DThinker).super_DObject._vptr_DObject + 0xd0))
                        (pAVar1,triggerer,activationType);
    }
    else {
      (this->super_ASectorAction).super_AActor.tracer.field_0.p = (AActor *)0x0;
    }
  }
  return (bool)(bVar3 | bVar2);
}

Assistant:

bool ASecActHitFakeFloor::DoTriggerAction (AActor *triggerer, int activationType)
{
	bool didit = (activationType & SECSPAC_HitFakeFloor) ? CheckTrigger (triggerer) : false;
	return didit | Super::DoTriggerAction (triggerer, activationType);
}